

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_xor.c
# Opt level: O1

int array_run_container_xor(array_container_t *src_1,run_container_t *src_2,container_t **dst)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  undefined8 in_RAX;
  run_container_t *dst_00;
  container_t *pcVar4;
  array_container_t *src_1_00;
  bitset_container_t *src_1_01;
  uint8_t typecode_after;
  byte local_21;
  
  local_21 = (byte)((ulong)in_RAX >> 0x38);
  if (src_1->cardinality < 0x20) {
    dst_00 = run_container_create();
    array_run_container_lazy_xor(src_1,src_2,dst_00);
    pcVar4 = convert_run_to_efficient_container_and_free(dst_00,&local_21);
    *dst = pcVar4;
    uVar3 = (uint)local_21;
  }
  else {
    iVar2 = run_container_cardinality(src_2);
    if (iVar2 < 0x1001) {
      src_1_00 = array_container_from_run(src_2);
      _Var1 = array_array_container_xor(src_1_00,src_1,dst);
      array_container_free(src_1_00);
    }
    else {
      src_1_01 = bitset_container_from_run(src_2);
      _Var1 = bitset_array_container_ixor(src_1_01,src_1,dst);
    }
    uVar3 = 2 - _Var1;
  }
  return uVar3;
}

Assistant:

int array_run_container_xor(const array_container_t *src_1,
                            const run_container_t *src_2, container_t **dst) {
    // semi following Java XOR implementation as of May 2016
    // the C OR implementation works quite differently and can return a run
    // container
    // TODO could optimize for full run containers.

    // use of lazy following Java impl.
    const int arbitrary_threshold = 32;
    if (src_1->cardinality < arbitrary_threshold) {
        run_container_t *ans = run_container_create();
        array_run_container_lazy_xor(src_1, src_2, ans);  // keeps runs.
        uint8_t typecode_after;
        *dst =
            convert_run_to_efficient_container_and_free(ans, &typecode_after);
        return typecode_after;
    }

    int card = run_container_cardinality(src_2);
    if (card <= DEFAULT_MAX_SIZE) {
        // Java implementation works with the array, xoring the run elements via
        // iterator
        array_container_t *temp = array_container_from_run(src_2);
        bool ret_is_bitset = array_array_container_xor(temp, src_1, dst);
        array_container_free(temp);
        return ret_is_bitset ? BITSET_CONTAINER_TYPE : ARRAY_CONTAINER_TYPE;

    } else {  // guess that it will end up as a bitset
        bitset_container_t *result = bitset_container_from_run(src_2);
        bool is_bitset = bitset_array_container_ixor(result, src_1, dst);
        // any necessary type conversion has been done by the ixor
        int retval = (is_bitset ? BITSET_CONTAINER_TYPE : ARRAY_CONTAINER_TYPE);
        return retval;
    }
}